

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall
cmFindPackageCommand::FindConfigFile(cmFindPackageCommand *this,string *dir,string *file)

{
  pointer pbVar1;
  bool bVar2;
  size_type sVar3;
  pointer pbVar4;
  string local_50;
  
  sVar3 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&this->IgnoredPaths,dir);
  if (sVar3 == 0) {
    pbVar1 = (this->Configs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = (this->Configs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1)
    {
      std::__cxx11::string::_M_assign((string *)file);
      std::__cxx11::string::append((char *)file);
      std::__cxx11::string::append((string *)file);
      if (this->DebugMode == true) {
        fprintf(_stderr,"Checking file [%s]\n",(file->_M_dataplus)._M_p);
      }
      bVar2 = cmsys::SystemTools::FileExists(file,true);
      if ((bVar2) && (bVar2 = CheckVersion(this,file), bVar2)) {
        if (this->UseRealPath != true) {
          return true;
        }
        cmsys::SystemTools::GetRealPath(&local_50,file,(string *)0x0);
        std::__cxx11::string::operator=((string *)file,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool cmFindPackageCommand::FindConfigFile(std::string const& dir,
                                          std::string& file)
{
  if (this->IgnoredPaths.count(dir)) {
    return false;
  }

  for (std::string const& c : this->Configs) {
    file = dir;
    file += "/";
    file += c;
    if (this->DebugMode) {
      fprintf(stderr, "Checking file [%s]\n", file.c_str());
    }
    if (cmSystemTools::FileExists(file, true) && this->CheckVersion(file)) {
      // Allow resolving symlinks when the config file is found through a link
      if (this->UseRealPath) {
        file = cmSystemTools::GetRealPath(file);
      }
      return true;
    }
  }
  return false;
}